

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O3

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,mp::QuadraticConeId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomConstraintData<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>
               *cfc,ItemNamer *vnam)

{
  ulong uVar1;
  Buffer<char> *pBVar2;
  char *pcVar3;
  size_t sVar4;
  
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 0xd;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  builtin_strncpy(pBVar2->ptr_ + sVar4,"QuadraticCone",0xd);
  pBVar2->size_ = uVar1;
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = '(';
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<int,std::allocator<int>>,int>
            (wrt,&cfc->args_,vnam);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  uVar1 = sVar4 + 2;
  if (pBVar2->capacity_ < uVar1) {
    (**pBVar2->_vptr_Buffer)(pBVar2,uVar1);
    sVar4 = pBVar2->size_;
  }
  pcVar3 = pBVar2->ptr_;
  (pcVar3 + sVar4)[0] = ',';
  (pcVar3 + sVar4)[1] = ' ';
  pBVar2->size_ = uVar1;
  WriteModelItemParameters<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::vector<double,std::allocator<double>>,double>
            (wrt,&cfc->params_);
  pBVar2 = (wrt->super_BasicWriter<char>).buffer_;
  sVar4 = pBVar2->size_;
  if (sVar4 == pBVar2->capacity_) {
    (**pBVar2->_vptr_Buffer)(pBVar2,sVar4 + 1);
    sVar4 = pBVar2->size_;
  }
  pBVar2->size_ = sVar4 + 1;
  pBVar2->ptr_[sVar4] = ')';
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomConstraintData<A,P,I>& cfc,
    ItemNamer& vnam) {
  wrt << cfc.GetTypeName();
  wrt << '(';
  WriteModelItem(wrt, cfc.GetArguments(), vnam);
  wrt << ", ";
  WriteModelItemParameters(wrt, cfc.GetParameters());
  wrt << ')';
}